

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

ByteData * __thiscall
cfd::TransactionController::CreateSignatureHash
          (TransactionController *this,Txid *txid,uint32_t vout,Pubkey *pubkey,
          SigHashType *sighash_type,Amount *value,WitnessVersion version)

{
  uint32_t txin_index_00;
  Transaction *this_00;
  uint32_t in_ECX;
  Txid *in_RDX;
  long in_RSI;
  ByteData *in_RDI;
  Pubkey *in_R8;
  SigHashType *in_R9;
  Amount *in_stack_00000008;
  WitnessVersion in_stack_00000010;
  ByteData256 sighash;
  uint32_t txin_index;
  Script script;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  SigHashType local_bc;
  ByteData local_b0;
  ByteData256 local_98;
  uint32_t local_6c;
  Script local_68;
  uint32_t local_1c;
  Txid *local_18;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  core::ScriptUtil::CreateP2pkhLockingScript(&local_68,in_R8);
  txin_index_00 = core::Transaction::GetTxInIndex((Transaction *)(in_RSI + 0x10),local_18,local_1c);
  this_00 = (Transaction *)(in_RSI + 0x10);
  local_6c = txin_index_00;
  core::Script::GetData(&local_b0,&local_68);
  core::SigHashType::SigHashType(&local_bc,in_R9);
  core::Transaction::GetSignatureHash
            (&local_98,this_00,txin_index_00,&local_b0,&local_bc,in_stack_00000008,in_stack_00000010
            );
  core::ByteData::~ByteData((ByteData *)0x5138f5);
  core::ByteData256::GetBytes(&local_d8,&local_98);
  core::ByteData::ByteData(in_RDI,&local_d8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_R9);
  core::ByteData256::~ByteData256((ByteData256 *)0x513931);
  core::Script::~Script((Script *)this_00);
  return in_RDI;
}

Assistant:

ByteData TransactionController::CreateSignatureHash(
    const Txid& txid, uint32_t vout, const Pubkey& pubkey,
    SigHashType sighash_type, const Amount& value,
    WitnessVersion version) const {
  Script script = ScriptUtil::CreateP2pkhLockingScript(pubkey);
  uint32_t txin_index = transaction_.GetTxInIndex(txid, vout);
  ByteData256 sighash = transaction_.GetSignatureHash(
      txin_index, script.GetData(), sighash_type, value, version);
  return ByteData(sighash.GetBytes());
}